

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O1

void __thiscall
kratos::InsertClockIRVisitor::InsertClockIRVisitor(InsertClockIRVisitor *this,Generator *top)

{
  UserException *this_00;
  undefined1 local_68 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ports;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  
  (this->super_IRVisitor).level = 0;
  (this->super_IRVisitor).visited_._M_h._M_buckets =
       &(this->super_IRVisitor).visited_._M_h._M_single_bucket;
  (this->super_IRVisitor).visited_._M_h._M_bucket_count = 1;
  (this->super_IRVisitor).visited_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->super_IRVisitor).visited_._M_h._M_element_count = 0;
  (this->super_IRVisitor).visited_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->super_IRVisitor).visited_._M_h._M_rehash_policy._M_next_resize = 0;
  (this->super_IRVisitor).visited_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->super_IRVisitor)._vptr_IRVisitor = (_func_int **)&PTR_visit_root_002bbd80;
  (this->clk_en_name_)._M_dataplus._M_p = (pointer)&(this->clk_en_name_).field_2;
  (this->clk_en_name_)._M_string_length = 0;
  (this->clk_en_name_).field_2._M_local_buf[0] = '\0';
  this->top_ = top;
  Generator::get_ports_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_68,top,ClockEnable);
  if (local_68 ==
      (undefined1  [8])
      ports.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    this->clk_en_ = (Port *)0x0;
  }
  else {
    if (0x20 < (ulong)((long)ports.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start - (long)local_68)) {
      this_00 = (UserException *)__cxa_allocate_exception(0x10);
      ports.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&stack0xffffffffffffffc0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 &ports.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 "Current the pass only support one clock enable signal in top","");
      UserException::UserException
                (this_00,(string *)
                         &ports.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      __cxa_throw(this_00,&UserException::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::_M_assign((string *)&this->clk_en_name_);
    Generator::get_port((Generator *)
                        &ports.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)top);
    this->clk_en_ =
         (Port *)ports.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_68);
  return;
}

Assistant:

explicit InsertClockIRVisitor(Generator* top) : top_(top) {
        // find out the top clock enable signal
        auto ports = top->get_ports(PortType::ClockEnable);
        // LCOV_EXCL_START
        if (ports.empty()) {
            clk_en_ = nullptr;
        } else if (ports.size() > 1) {
            throw UserException("Current the pass only support one clock enable signal in top");
        } else {
            // LCOV_EXCL_STOP
            clk_en_name_ = ports[0];
            clk_en_ = top->get_port(clk_en_name_).get();
        }
    }